

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

LY_ERR lyht_find_next_with_collision_cb
                 (ly_ht *ht,void *val_p,uint32_t hash,lyht_value_equal_cb val_equal,void **match_p)

{
  char cVar1;
  LY_ERR LVar2;
  lyht_value_equal_cb local_68;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t i;
  uint32_t rec_idx;
  ly_ht_rec *rec;
  void **match_p_local;
  lyht_value_equal_cb val_equal_local;
  void *pvStack_20;
  uint32_t hash_local;
  void *val_p_local;
  ly_ht *ht_local;
  
  local_68 = val_equal;
  if (val_equal == (lyht_value_equal_cb)0x0) {
    local_68 = ht->val_equal;
  }
  rec = (ly_ht_rec *)match_p;
  match_p_local = (void **)val_equal;
  val_equal_local._4_4_ = hash;
  pvStack_20 = val_p;
  val_p_local = ht;
  LVar2 = lyht_find_rec(ht,val_p,hash,'\x01',local_68,&local_48,(ly_ht_rec **)&i);
  if (LVar2 == LY_SUCCESS) {
    local_44 = _i->next;
    _i = lyht_get_rec(*(uchar **)((long)val_p_local + 0x28),*(uint16_t *)((long)val_p_local + 0x1a),
                      local_44);
    while (local_44 != 0xffffffff) {
      if (_i->hash == val_equal_local._4_4_) {
        if (match_p_local == (void **)0x0) {
          cVar1 = (**(code **)((long)val_p_local + 8))
                            (pvStack_20,_i->val,0,*(undefined8 *)((long)val_p_local + 0x10));
          if (cVar1 != '\0') {
            if (rec != (ly_ht_rec *)0x0) {
              *(uchar **)rec = _i->val;
            }
            return LY_SUCCESS;
          }
        }
        else {
          cVar1 = (*(code *)match_p_local)
                            (pvStack_20,_i->val,0,*(undefined8 *)((long)val_p_local + 0x10));
          if (cVar1 != '\0') {
            if (rec != (ly_ht_rec *)0x0) {
              *(uchar **)rec = _i->val;
            }
            return LY_SUCCESS;
          }
        }
      }
      local_44 = _i->next;
      _i = lyht_get_rec(*(uchar **)((long)val_p_local + 0x28),
                        *(uint16_t *)((long)val_p_local + 0x1a),local_44);
    }
    ht_local._4_4_ = LY_ENOTFOUND;
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c",
           0x141);
    ht_local._4_4_ = LY_EINT;
  }
  return ht_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyht_find_next_with_collision_cb(const struct ly_ht *ht, void *val_p, uint32_t hash,
        lyht_value_equal_cb val_equal, void **match_p)
{
    struct ly_ht_rec *rec;
    uint32_t rec_idx;
    uint32_t i;

    /* find the record of the previously found value */
    if (lyht_find_rec(ht, val_p, hash, 1, val_equal ? val_equal : ht->val_equal, &i, &rec)) {
        /* not found, cannot happen */
        LOGINT_RET(NULL);
    }

    for (rec_idx = rec->next, rec = lyht_get_rec(ht->recs, ht->rec_size, rec_idx);
            rec_idx != LYHT_NO_RECORD;
            rec_idx = rec->next, rec = lyht_get_rec(ht->recs, ht->rec_size, rec_idx)) {

        if (rec->hash != hash) {
            continue;
        }

        if (val_equal) {
            if (val_equal(val_p, &rec->val, 0, ht->cb_data)) {
                /* even the value matches */
                if (match_p) {
                    *match_p = rec->val;
                }
                return LY_SUCCESS;
            }
        } else if (ht->val_equal(val_p, &rec->val, 0, ht->cb_data)) {
            /* even the value matches */
            if (match_p) {
                *match_p = rec->val;
            }
            return LY_SUCCESS;
        }
    }

    /* the last equal value was already returned */
    return LY_ENOTFOUND;
}